

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.c
# Opt level: O3

void DrawTextureTiled(Texture2D texture,Rectangle source,Rectangle dest,Vector2 origin,
                     float rotation,float scale,Color tint)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined8 uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  float fVar11;
  float fVar12;
  float fVar19;
  float fVar20;
  float fVar21;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  float fVar22;
  float in_XMM3_Dc;
  float in_XMM3_Dd;
  float fVar23;
  Rectangle source_00;
  Rectangle source_01;
  Rectangle source_02;
  Rectangle source_03;
  Rectangle source_04;
  Rectangle dest_00;
  Rectangle dest_01;
  Rectangle dest_02;
  Rectangle dest_03;
  Rectangle dest_04;
  Rectangle dest_05;
  undefined8 local_e8;
  
  dest_03.width = dest.width;
  dest_04.height = dest.height;
  dest_03.x = dest.x;
  dest_04.y = dest.y;
  if ((0.0 < scale) && (texture.id != 0)) {
    source_00.width = source.width;
    source_01.height = source.height;
    fVar20 = source.width;
    fVar21 = source.height;
    iVar10 = (int)(scale * source_01.height);
    fVar12 = (float)(int)(source_00.width * scale);
    fVar19 = (float)(int)source_01.height;
    fVar23 = (float)iVar10;
    uVar4 = source._0_8_;
    if ((dest_03.width < fVar12) && (dest_04.height < fVar23)) {
      auVar13._8_4_ = in_XMM3_Dc;
      auVar13._0_8_ = dest._8_8_;
      auVar13._12_4_ = in_XMM3_Dd;
      auVar1._4_4_ = fVar23;
      auVar1._0_4_ = fVar12;
      auVar1._8_4_ = fVar19;
      auVar1._12_4_ = 0;
      auVar14 = divps(auVar13,auVar1);
      auVar15._0_4_ = auVar14._0_4_ * source_00.width;
      auVar15._4_4_ = auVar14._4_4_ * source_01.height;
      auVar15._8_4_ = auVar14._8_4_ * fVar20;
      auVar15._12_4_ = auVar14._12_4_ * fVar21;
LAB_0014114e:
      source_04._8_8_ = auVar15._0_8_;
      source_04.x = (float)(int)uVar4;
      source_04.y = (float)(int)((ulong)uVar4 >> 0x20);
      dest_05.y = dest_04.y;
      dest_05.x = dest_03.x;
      dest_05.height = dest_04.height;
      dest_05.width = dest_03.width;
      DrawTexturePro(texture,source_04,dest_05,origin,rotation,tint);
      return;
    }
    if (dest_03.width <= fVar12) {
      fVar22 = 0.0;
      if (fVar23 < dest_04.height) {
        iVar9 = 0;
        do {
          dest_03.height = fVar23;
          source_02.width = (dest_03.width / fVar12) * source_00.width;
          source_02.height = source_01.height;
          source_02.x = (float)(int)uVar4;
          source_02.y = (float)(int)((ulong)uVar4 >> 0x20);
          dest_03.y = (float)iVar9 + dest_04.y;
          DrawTexturePro(texture,source_02,dest_03,origin,rotation,tint);
          iVar7 = iVar9 + iVar10 * 2;
          iVar9 = iVar9 + iVar10;
        } while ((float)iVar7 < dest_04.height);
        fVar22 = (float)iVar9;
      }
      if (fVar22 < dest_04.height) {
        dest_04.height = dest_04.height - fVar22;
        auVar17._4_4_ = dest_04.height;
        auVar17._0_4_ = dest_03.width;
        auVar17._8_4_ = in_XMM3_Dc;
        auVar17._12_4_ = in_XMM3_Dd;
        auVar14._4_4_ = fVar23;
        auVar14._0_4_ = fVar12;
        auVar14._8_4_ = fVar19;
        auVar14._12_4_ = 0;
        auVar14 = divps(auVar17,auVar14);
        auVar15._0_4_ = auVar14._0_4_ * source_00.width;
        auVar15._4_4_ = auVar14._4_4_ * source_01.height;
        auVar15._8_4_ = auVar14._8_4_ * fVar20;
        auVar15._12_4_ = auVar14._12_4_ * fVar21;
        dest_04.y = fVar22 + dest_04.y;
        goto LAB_0014114e;
      }
    }
    else {
      iVar9 = (int)(source_00.width * scale);
      if (fVar23 < dest_04.height) {
        fVar22 = 0.0;
        if (fVar12 < dest_03.width) {
          iVar7 = 0;
          iVar8 = iVar9;
          do {
            iVar5 = iVar8;
            fVar22 = 0.0;
            if (fVar23 < dest_04.height) {
              iVar8 = 0;
              do {
                dest_00.y = (float)iVar8 + dest_04.y;
                dest_00.x = dest_03.x + (float)iVar7;
                dest_00.height = fVar23;
                dest_00.width = fVar12;
                DrawTexturePro(texture,source,dest_00,origin,rotation,tint);
                iVar6 = iVar8 + iVar10 * 2;
                iVar8 = iVar8 + iVar10;
              } while ((float)iVar6 < dest_04.height);
              fVar22 = (float)iVar8;
            }
            if (fVar22 < dest_04.height) {
              dest_01.x = (float)iVar7 + dest_03.x;
              dest_01.y = fVar22 + dest_04.y;
              source_00.height = ((dest_04.height - fVar22) / fVar23) * source_01.height;
              source_00.x = (float)(int)uVar4;
              source_00.y = (float)(int)((ulong)uVar4 >> 0x20);
              dest_01.height = dest_04.height - fVar22;
              dest_01.width = fVar12;
              DrawTexturePro(texture,source_00,dest_01,origin,rotation,tint);
            }
            iVar7 = iVar5;
            iVar8 = iVar9 + iVar5;
          } while ((float)(iVar9 + iVar5) < dest_03.width);
          fVar22 = (float)iVar5;
        }
        if (fVar22 < dest_03.width) {
          fVar11 = 0.0;
          if (fVar23 < dest_04.height) {
            iVar9 = 0;
            do {
              source_01.width = ((dest_03.width - fVar22) / fVar12) * source_00.width;
              source_01.x = (float)(int)uVar4;
              source_01.y = (float)(int)((ulong)uVar4 >> 0x20);
              dest_02.y = (float)iVar9 + dest_04.y;
              dest_02.x = dest_03.x + fVar22;
              dest_02.width = dest_03.width - fVar22;
              dest_02.height = fVar23;
              DrawTexturePro(texture,source_01,dest_02,origin,rotation,tint);
              iVar7 = iVar9 + iVar10 * 2;
              iVar9 = iVar9 + iVar10;
            } while ((float)iVar7 < dest_04.height);
            fVar11 = (float)iVar9;
          }
          if (fVar11 < dest_04.height) {
            dest_03.width = dest_03.width - fVar22;
            dest_04.height = dest_04.height - fVar11;
            auVar16._4_4_ = dest_04.height;
            auVar16._0_4_ = dest_03.width;
            auVar16._8_4_ = in_XMM3_Dc - 0.0;
            auVar16._12_4_ = in_XMM3_Dd - 0.0;
            auVar2._4_4_ = fVar23;
            auVar2._0_4_ = fVar12;
            auVar2._8_4_ = fVar19;
            auVar2._12_4_ = 0;
            auVar14 = divps(auVar16,auVar2);
            auVar15._0_4_ = auVar14._0_4_ * source_00.width;
            auVar15._4_4_ = auVar14._4_4_ * source_01.height;
            auVar15._8_4_ = auVar14._8_4_ * fVar20;
            auVar15._12_4_ = auVar14._12_4_ * fVar21;
            dest_03.x = fVar22 + dest_03.x;
            dest_04.y = fVar11 + dest_04.y;
            goto LAB_0014114e;
          }
        }
      }
      else {
        fVar22 = 0.0;
        if (fVar12 < dest_03.width) {
          source_03.height = source_01.height * (dest_04.height / fVar23);
          source_03.width = source_00.width;
          iVar10 = 0;
          do {
            dest_04.width = fVar12;
            source_03.x = (float)(int)uVar4;
            source_03.y = (float)(int)((ulong)uVar4 >> 0x20);
            dest_04.x = (float)iVar10 + dest_03.x;
            DrawTexturePro(texture,source_03,dest_04,origin,rotation,tint);
            iVar7 = iVar9 * 2 + iVar10;
            iVar10 = iVar10 + iVar9;
          } while ((float)iVar7 < dest_03.width);
          fVar22 = (float)iVar10;
        }
        if (fVar22 < dest_03.width) {
          auVar18._0_4_ = dest_03.width - fVar22;
          auVar18._4_4_ = dest_04.height;
          auVar18._8_4_ = in_XMM3_Dc;
          auVar18._12_4_ = in_XMM3_Dd;
          auVar3._4_4_ = fVar23;
          auVar3._0_4_ = fVar12;
          auVar3._8_4_ = fVar19;
          auVar3._12_4_ = 0;
          auVar14 = divps(auVar18,auVar3);
          auVar15._0_4_ = auVar14._0_4_ * source_00.width;
          auVar15._4_4_ = auVar14._4_4_ * source_01.height;
          auVar15._8_4_ = auVar14._8_4_ * fVar20;
          auVar15._12_4_ = auVar14._12_4_ * fVar21;
          dest_03.x = fVar22 + dest_03.x;
          dest_03.width = auVar18._0_4_;
          goto LAB_0014114e;
        }
      }
    }
  }
  return;
}

Assistant:

void DrawTextureTiled(Texture2D texture, Rectangle source, Rectangle dest, Vector2 origin, float rotation, float scale, Color tint)
{
    if ((texture.id <= 0) || (scale <= 0.0f)) return;  // Wanna see a infinite loop?!...just delete this line!

    int tileWidth = (int)(source.width*scale), tileHeight = (int)(source.height*scale);
    if ((dest.width < tileWidth) && (dest.height < tileHeight))
    {
        // Can fit only one tile
        DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)dest.width/tileWidth)*source.width, ((float)dest.height/tileHeight)*source.height},
                    (Rectangle){dest.x, dest.y, dest.width, dest.height}, origin, rotation, tint);
    }
    else if (dest.width <= tileWidth)
    {
        // Tiled vertically (one column)
        int dy = 0;
        for (;dy+tileHeight < dest.height; dy += tileHeight)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)dest.width/tileWidth)*source.width, source.height}, (Rectangle){dest.x, dest.y + dy, dest.width, (float)tileHeight}, origin, rotation, tint);
        }

        // Fit last tile
        if (dy < dest.height)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)dest.width/tileWidth)*source.width, ((float)(dest.height - dy)/tileHeight)*source.height},
                        (Rectangle){dest.x, dest.y + dy, dest.width, dest.height - dy}, origin, rotation, tint);
        }
    }
    else if (dest.height <= tileHeight)
    {
        // Tiled horizontally (one row)
        int dx = 0;
        for (;dx+tileWidth < dest.width; dx += tileWidth)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, source.width, ((float)dest.height/tileHeight)*source.height}, (Rectangle){dest.x + dx, dest.y, (float)tileWidth, dest.height}, origin, rotation, tint);
        }

        // Fit last tile
        if (dx < dest.width)
        {
            DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)(dest.width - dx)/tileWidth)*source.width, ((float)dest.height/tileHeight)*source.height},
                        (Rectangle){dest.x + dx, dest.y, dest.width - dx, dest.height}, origin, rotation, tint);
        }
    }
    else
    {
        // Tiled both horizontally and vertically (rows and columns)
        int dx = 0;
        for (;dx+tileWidth < dest.width; dx += tileWidth)
        {
            int dy = 0;
            for (;dy+tileHeight < dest.height; dy += tileHeight)
            {
                DrawTexturePro(texture, source, (Rectangle){dest.x + dx, dest.y + dy, (float)tileWidth, (float)tileHeight}, origin, rotation, tint);
            }

            if (dy < dest.height)
            {
                DrawTexturePro(texture, (Rectangle){source.x, source.y, source.width, ((float)(dest.height - dy)/tileHeight)*source.height},
                    (Rectangle){dest.x + dx, dest.y + dy, (float)tileWidth, dest.height - dy}, origin, rotation, tint);
            }
        }

        // Fit last column of tiles
        if (dx < dest.width)
        {
            int dy = 0;
            for (;dy+tileHeight < dest.height; dy += tileHeight)
            {
                DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)(dest.width - dx)/tileWidth)*source.width, source.height},
                        (Rectangle){dest.x + dx, dest.y + dy, dest.width - dx, (float)tileHeight}, origin, rotation, tint);
            }

            // Draw final tile in the bottom right corner
            if (dy < dest.height)
            {
                DrawTexturePro(texture, (Rectangle){source.x, source.y, ((float)(dest.width - dx)/tileWidth)*source.width, ((float)(dest.height - dy)/tileHeight)*source.height},
                    (Rectangle){dest.x + dx, dest.y + dy, dest.width - dx, dest.height - dy}, origin, rotation, tint);
            }
        }
    }
}